

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util_test.cc
# Opt level: O0

string * __thiscall
google::protobuf::util::SnakeCaseCamelCaseTest::SnakeCaseToCamelCase
          (string *__return_storage_ptr__,SnakeCaseCamelCaseTest *this,string *input)

{
  bool bVar1;
  string_view input_00;
  allocator<char> local_61;
  undefined4 local_60;
  undefined1 local_50 [16];
  string local_40 [8];
  string output;
  string *input_local;
  SnakeCaseCamelCaseTest *this_local;
  
  output.field_2._8_8_ = input;
  std::__cxx11::string::string(local_40);
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)output.field_2._8_8_);
  input_00._M_str = (char *)local_40;
  input_00._M_len = local_50._8_8_;
  bVar1 = FieldMaskUtil::SnakeCaseToCamelCase(local_50._0_8_,input_00,(string *)local_50._0_8_);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"#FAIL#",&local_61);
    std::allocator<char>::~allocator(&local_61);
  }
  local_60 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string SnakeCaseToCamelCase(const std::string& input) {
    std::string output;
    if (FieldMaskUtil::SnakeCaseToCamelCase(input, &output)) {
      return output;
    } else {
      return "#FAIL#";
    }
  }